

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingElement::~IfcReinforcingElement(IfcReinforcingElement *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject.field_0x50;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x50 = 0x84d730;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x38 = 0x84d870;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd8 = 0x84d758;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.field_0xe8 = 0x84d780;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.field_0x120
       = 0x84d7a8;
  *(undefined8 *)&this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.field_0x150 =
       0x84d7d0;
  *(undefined8 *)&this[-1].field_0x188 = 0x84d7f8;
  *(undefined8 *)&this[-1].field_0x198 = 0x84d820;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0x84d848;
  puVar1 = *(undefined1 **)
            &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
            super_IfcProduct.super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this_00,&PTR_construction_vtable_24__0084d898);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcReinforcingElement() : Object("IfcReinforcingElement") {}